

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::win_set_var(Nvim *this,Window window,string *name,Object *value)

{
  string local_80;
  Window local_60;
  variant<_cf2d41c5_> local_58;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = window;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"nvim_win_set_var","");
  NvimRPC::
  do_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            ((Object *)&local_58,&this->client_,&local_80,&local_60,name,value);
  boost::variant<$cf2d41c5$>::destroy_content(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::win_set_var(Window window, const std::string& name, const Object& value) {
    client_.call("nvim_win_set_var", nullptr, window, name, value);
}